

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O0

void __thiscall CppUnit::TestResult::endTest(TestResult *this,Test *test)

{
  bool bVar1;
  reference ppTVar2;
  iterator local_60;
  undefined1 local_40 [8];
  iterator it;
  ExclusiveZone zone;
  Test *test_local;
  TestResult *this_local;
  
  SynchronizedObject::ExclusiveZone::ExclusiveZone
            ((ExclusiveZone *)&it._M_node,(this->super_SynchronizedObject).m_syncObject);
  std::deque<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>::begin
            ((iterator *)local_40,&this->m_listeners);
  while( true ) {
    std::deque<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>::end
              (&local_60,&this->m_listeners);
    bVar1 = std::operator!=((_Self *)local_40,&local_60);
    if (!bVar1) break;
    ppTVar2 = std::
              _Deque_iterator<CppUnit::TestListener_*,_CppUnit::TestListener_*&,_CppUnit::TestListener_**>
              ::operator*((_Deque_iterator<CppUnit::TestListener_*,_CppUnit::TestListener_*&,_CppUnit::TestListener_**>
                           *)local_40);
    (*(*ppTVar2)->_vptr_TestListener[4])(*ppTVar2,test);
    std::
    _Deque_iterator<CppUnit::TestListener_*,_CppUnit::TestListener_*&,_CppUnit::TestListener_**>::
    operator++((_Deque_iterator<CppUnit::TestListener_*,_CppUnit::TestListener_*&,_CppUnit::TestListener_**>
                *)local_40);
  }
  SynchronizedObject::ExclusiveZone::~ExclusiveZone((ExclusiveZone *)&it._M_node);
  return;
}

Assistant:

void 
TestResult::endTest( Test *test )
{ 
  ExclusiveZone zone( m_syncObject ); 
  for ( TestListeners::iterator it = m_listeners.begin();
        it != m_listeners.end(); 
        ++it )
    (*it)->endTest( test );
}